

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteActions::MADPComponentDiscreteActions
          (MADPComponentDiscreteActions *this,MADPComponentDiscreteActions *a)

{
  pointer ppJVar1;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
  *this_00;
  size_t *psVar2;
  JointActionDiscrete *this_01;
  const_reference ppJVar3;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *pmVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  uint uVar7;
  undefined1 auVar8 [32];
  JointActionDiscrete *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  this->_vptr_MADPComponentDiscreteActions =
       (_func_int **)&PTR__MADPComponentDiscreteActions_00610ce0;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8 = ZEXT432(0) << 0x40;
  this->_m_nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar8._0_24_;
  (this->_m_actionVecs).
  super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar8._24_8_;
  *(undefined1 (*) [32])
   &(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar8;
  this->_m_initialized = a->_m_initialized;
  this->_m_cachedAllJointActions = a->_m_cachedAllJointActions;
  this->_m_jointIndicesValid = a->_m_jointIndicesValid;
  this->_m_nrJointActions = a->_m_nrJointActions;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->_m_nrActions,&a->_m_nrActions);
  psVar2 = IndexTools::CalculateStepSize(&this->_m_nrActions);
  this->_m_actionStepSize = psVar2;
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::operator=(&this->_m_actionVecs,&a->_m_actionVecs);
  ppJVar1 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar1) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar1;
  }
  for (uVar7 = 0;
      (long)(a->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(a->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar7; uVar7 = uVar7 + 1) {
    this_01 = (JointActionDiscrete *)operator_new(0x48);
    ppJVar3 = std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::at
                        (&a->_m_jointActionVec,(ulong)uVar7);
    JointActionDiscrete::JointActionDiscrete(this_01,*ppJVar3);
    local_40 = this_01;
    std::vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>>::
    emplace_back<JointActionDiscrete*>
              ((vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>> *)
               &this->_m_jointActionVec,&local_40);
  }
  pmVar4 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
            *)operator_new(0x30);
  p_Var6 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(pmVar4->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_m_jointActionIndices = pmVar4;
  pmVar4 = a->_m_jointActionIndices;
  if (pmVar4 != (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                 *)0x0) {
    p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var5 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
      this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                 *)this->_m_jointActionIndices;
      this_02 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (this_02,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var5[1]._M_parent)
      ;
      local_40 = (JointActionDiscrete *)CONCAT44(local_40._4_4_,p_Var5[1]._M_color);
      local_38 = this_02;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                (this_00,(pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>
                          *)&local_40);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      pmVar4 = a->_m_jointActionIndices;
    }
  }
  return;
}

Assistant:

MADPComponentDiscreteActions::MADPComponentDiscreteActions(
    const MADPComponentDiscreteActions& a)
{
    _m_initialized=a._m_initialized;
    _m_cachedAllJointActions=a._m_cachedAllJointActions;
    _m_jointIndicesValid=a._m_jointIndicesValid;
    _m_nrJointActions=a._m_nrJointActions;
    _m_nrActions=a._m_nrActions;
    _m_actionStepSize=IndexTools::CalculateStepSize(_m_nrActions);
    _m_actionVecs=a._m_actionVecs;

    _m_jointActionVec.clear();
    for(Index ja=0;ja!=a._m_jointActionVec.size();++ja)
        _m_jointActionVec.push_back(new JointActionDiscrete(*a._m_jointActionVec.at(ja)));

    _m_jointActionIndices=new map<Index, vector<Index> *>();
    if(a._m_jointActionIndices)
    {
        map<Index, vector<Index> *>::const_iterator iter;
        for(iter = a._m_jointActionIndices->begin();
            iter != a._m_jointActionIndices->end();
            ++iter)
            _m_jointActionIndices->insert(make_pair( iter->first, new vector<Index>(*iter->second ))); 
    }
}